

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> WeakHashLen32WithSeeds(char *s,uint64 a,uint64 b)

{
  uint64 w;
  uint64 x;
  uint64 y;
  uint64 z;
  pair<unsigned_long,_unsigned_long> pVar1;
  uint64 b_local;
  uint64 a_local;
  char *s_local;
  
  w = Fetch64(s);
  x = Fetch64(s + 8);
  y = Fetch64(s + 0x10);
  z = Fetch64(s + 0x18);
  pVar1 = WeakHashLen32WithSeeds(w,x,y,z,a,b);
  return pVar1;
}

Assistant:

static pair<uint64, uint64> WeakHashLen32WithSeeds(
    const char* s, uint64 a, uint64 b) {
  return WeakHashLen32WithSeeds(Fetch64(s),
                                Fetch64(s + 8),
                                Fetch64(s + 16),
                                Fetch64(s + 24),
                                a,
                                b);
}